

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O1

bool __thiscall
sf::priv::WindowImpl::createVulkanSurface
          (WindowImpl *this,VkInstance *instance,VkSurfaceKHR *surface,
          VkAllocationCallbacks *allocator)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*this->_vptr_WindowImpl[2])();
  bVar1 = VulkanImplX11::createVulkanSurface
                    (instance,CONCAT44(extraout_var,iVar2),surface,allocator);
  return bVar1;
}

Assistant:

bool WindowImpl::createVulkanSurface(const VkInstance& instance, VkSurfaceKHR& surface, const VkAllocationCallbacks* allocator)
{
#if defined(SFML_VULKAN_IMPLEMENTATION_NOT_AVAILABLE)

    (void) instance;
    (void) surface;
    (void) allocator;
    return false;

#else

    return VulkanImplType::createVulkanSurface(instance, getSystemHandle(), surface, allocator);

#endif
}